

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GiftsandFavour.cpp
# Opt level: O0

void __thiscall GiftsandFavour::GiftsandFavour(GiftsandFavour *this,string *n,int t,int spT)

{
  string local_40 [32];
  int local_20;
  int local_1c;
  int spT_local;
  int t_local;
  string *n_local;
  GiftsandFavour *this_local;
  
  local_20 = spT;
  local_1c = t;
  _spT_local = n;
  n_local = (string *)this;
  std::__cxx11::string::string(local_40,(string *)n);
  Holding::Holding(&this->super_Holding,(string *)local_40,local_1c,local_20,2,2);
  std::__cxx11::string::~string(local_40);
  (this->super_Holding).super_BlackCard.super_Card._vptr_Card =
       (_func_int **)&PTR_effectBonus_0012bd30;
  std::__cxx11::string::string((string *)&this->name);
  this->upperHolding = (Holding *)0x0;
  this->subHolding = (Holding *)0x0;
  std::__cxx11::string::operator=((string *)&this->name,(string *)n);
  this->cost = 2;
  this->tapped = false;
  this->revealed = false;
  this->harvestValue = 2;
  return;
}

Assistant:

GiftsandFavour::GiftsandFavour(string n, int t, int spT) : Holding{n, t, spT, 2, 2}
{
    name = n;
    cost = 2;
    tapped = false;
    revealed = false;
    harvestValue = 2;
}